

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
::lower_bound<phmap::priv::(anonymous_namespace)::StringLike>
          (btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
           *this,StringLike *key)

{
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
  *pbVar1;
  SearchResult<int,_false> SVar2;
  undefined4 extraout_var;
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
  *this_00;
  key_compare *in_RDX;
  undefined8 extraout_RDX;
  key_compare *extraout_RDX_00;
  iterator iVar4;
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
  *pbVar3;
  
  this_00 = (this->root_).
            super__Tuple_impl<0UL,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>_*>
            .
            super__Tuple_impl<1UL,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>_*>
            .
            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>_*>
            .
            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>_*,_false>
            ._M_head_impl;
  while( true ) {
    SVar2 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
            ::lower_bound<phmap::priv::(anonymous_namespace)::StringLike>(this_00,key,in_RDX);
    pbVar3 = (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
              *)CONCAT44(extraout_var,SVar2.value);
    if (((ulong)this_00 & 7) != 0) break;
    if (this_00[0xb] !=
        (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
         )0x0) goto LAB_001a7f69;
    this_00 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
              ::child(this_00,(long)SVar2.value);
    in_RDX = extraout_RDX_00;
  }
LAB_001a7f95:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *, unsigned char, phmap::priv::(anonymous namespace)::StringLike, phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *, unsigned char, phmap::priv::(anonymous namespace)::StringLike, phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
LAB_001a7f69:
  if (((ulong)this_00 & 7) != 0) goto LAB_001a7f95;
  if ((uint)pbVar3 != (uint)(byte)this_00[10]) goto LAB_001a7f7d;
  pbVar1 = *(btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
             **)this_00;
  if (((ulong)pbVar1 & 7) != 0) goto LAB_001a7f95;
  pbVar3 = (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
            *)(ulong)(byte)this_00[8];
  this_00 = pbVar1;
  if (pbVar1[0xb] !=
      (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
       )0x0) {
    this_00 = (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
               *)0x0;
LAB_001a7f7d:
    if (this_00 ==
        (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
         *)0x0) {
      iVar4 = end(this);
      return iVar4;
    }
    iVar4._8_8_ = extraout_RDX;
    iVar4.node = pbVar3;
    return iVar4;
  }
  goto LAB_001a7f69;
}

Assistant:

iterator lower_bound(const K &key) {
            return internal_end(internal_lower_bound(key));
        }